

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O1

void Godunov::ExtrapVelToFaces
               (MultiFab *a_vel,MultiFab *a_forces,MultiFab *a_umac,MultiFab *a_vmac,
               MultiFab *a_wmac,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,
               BCRec *d_bcrec,Geometry *geom,Real l_dt,bool use_ppm,bool use_forces_in_trans)

{
  double *pdVar1;
  Geometry geom_00;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec_00;
  int iVar2;
  long lVar3;
  Geometry *pGVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  undefined1 in_stack_fffffffffffff7f0 [64];
  undefined8 in_stack_fffffffffffff830;
  Array4<double> *in_stack_fffffffffffff838;
  Array4<double> *in_stack_fffffffffffff840;
  Array4<const_double> *in_stack_fffffffffffff848;
  Array4<const_double> *in_stack_fffffffffffff850;
  Array4<const_double> *in_stack_fffffffffffff858;
  Array4<const_double> *in_stack_fffffffffffff860;
  Array4<double> *in_stack_fffffffffffff868;
  Array4<double> *in_stack_fffffffffffff870;
  Array4<double> *in_stack_fffffffffffff878;
  Array4<double> *in_stack_fffffffffffff880;
  Array4<double> *in_stack_fffffffffffff888;
  Array4<double> *in_stack_fffffffffffff890;
  Array4<const_double> *in_stack_fffffffffffff898;
  Box *in_stack_fffffffffffff8a0;
  Real *in_stack_fffffffffffff8a8;
  BCRec *in_stack_fffffffffffff8b0;
  Box result;
  undefined1 local_6f8 [32];
  Dim3 local_6d8;
  Dim3 local_6cc;
  int local_6c0;
  Box local_6b4;
  undefined1 local_698 [40];
  int local_670;
  Dim3 local_66c;
  int local_660;
  undefined1 local_658 [40];
  int local_630;
  Dim3 local_62c;
  int local_620;
  undefined1 local_618 [40];
  int local_5f0;
  Dim3 local_5ec;
  int local_5e0;
  Array4<double> local_5d8;
  Array4<double> local_598;
  Array4<double> local_558;
  Array4<double> local_518;
  Array4<double> local_4d8;
  Array4<double> local_498;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_458;
  Real *local_450;
  Box *local_448;
  FabArray<amrex::FArrayBox> *local_440;
  FabArray<amrex::FArrayBox> *local_438;
  FabArray<amrex::FArrayBox> *local_430;
  FabArray<amrex::FArrayBox> *local_428;
  FabArray<amrex::FArrayBox> *local_420;
  ulong local_418;
  double *local_410;
  int local_408;
  int local_404 [2];
  int local_3fc;
  IndexType local_3f8;
  double *local_3f0;
  int local_3e8;
  int local_3e4 [2];
  int local_3dc;
  IndexType local_3d8;
  double *local_3d0;
  int local_3c8;
  int local_3c4 [2];
  int local_3bc;
  IndexType local_3b8;
  undefined1 local_3b0 [32];
  Dim3 local_390;
  Dim3 local_384;
  int local_378;
  undefined1 local_370 [32];
  Dim3 local_350;
  Dim3 local_344;
  int local_338;
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  MFIter mfi;
  Box local_20c;
  Box local_1f0;
  Box local_1d4;
  FArrayBox scratch;
  Array4<const_double> local_170;
  Array4<const_double> local_130;
  Array4<double> local_f0;
  Array4<double> local_b0;
  Array4<double> local_70;
  
  bVar11 = 0;
  local_458 = h_bcrec;
  local_438 = &a_forces->super_FabArray<amrex::FArrayBox>;
  local_430 = &a_umac->super_FabArray<amrex::FArrayBox>;
  local_428 = &a_vmac->super_FabArray<amrex::FArrayBox>;
  local_420 = &a_wmac->super_FabArray<amrex::FArrayBox>;
  amrex::FArrayBox::FArrayBox(&scratch);
  local_440 = &a_vel->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_vel,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_448 = &geom->domain;
    local_450 = (geom->super_CoordSys).dx;
    do {
      amrex::MFIter::tilebox(&local_6b4,&mfi);
      result.smallend.vect[2] = local_6b4.smallend.vect[2] + -1;
      result.bigend.vect[0] = local_6b4.bigend.vect[0] + 1;
      result.smallend.vect[1] = local_6b4.smallend.vect[1] - 1;
      result.smallend.vect[0] = local_6b4.smallend.vect[0] + -1;
      result.bigend.vect[1] = local_6b4.bigend.vect[1] + 1;
      result.bigend.vect[2] = local_6b4.bigend.vect[2] + 1;
      amrex::MFIter::nodaltilebox(&local_1d4,&mfi,0);
      amrex::MFIter::nodaltilebox(&local_1f0,&mfi,1);
      amrex::MFIter::nodaltilebox(&local_20c,&mfi,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_70,local_430,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_b0,local_428,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_f0,local_420,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,local_440,&mfi)
      ;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_130,local_438,&mfi)
      ;
      amrex::FArrayBox::resize(&scratch,&result,0x27,(Arena *)0x0);
      h_bcrec_00 = local_458;
      lVar6 = (long)result.bigend.vect[1] + 1;
      iVar5 = (int)lVar6 - result.smallend.vect[1];
      local_498.p = scratch.super_BaseFab<double>.dptr;
      local_5d8.jstride = ((long)result.bigend.vect[0] - (long)result.smallend.vect[0]) + 1;
      local_498.kstride = (lVar6 - result.smallend.vect[1]) * local_5d8.jstride;
      local_5d8.nstride = ((long)result.bigend.vect[2] + 1) - (long)result.smallend.vect[2];
      local_498.nstride = local_498.kstride * local_5d8.nstride;
      local_498.begin.x = result.smallend.vect[0];
      local_498.begin.y = result.smallend.vect[1];
      local_498.begin.z = result.smallend.vect[2];
      local_5d8.end._0_8_ = (long)result.bigend.vect[0] + 1U & 0xffffffff | lVar6 << 0x20;
      local_5d8.end.z = (int)((long)result.bigend.vect[2] + 1);
      local_4d8.p = scratch.super_BaseFab<double>.dptr + local_498.nstride * 3;
      local_5d8.kstride = iVar5 * local_5d8.jstride;
      local_5d8.nstride = local_5d8.nstride * local_5d8.kstride;
      local_4d8.begin.x = result.smallend.vect[0];
      local_4d8.begin.y = result.smallend.vect[1];
      local_4d8.begin.z = result.smallend.vect[2];
      local_518.p = local_4d8.p + local_5d8.nstride * 3;
      local_518.begin.x = result.smallend.vect[0];
      local_518.begin.y = result.smallend.vect[1];
      local_518.begin.z = result.smallend.vect[2];
      local_558.p = local_518.p + local_5d8.nstride * 3;
      local_558.begin.x = result.smallend.vect[0];
      local_558.begin.y = result.smallend.vect[1];
      local_558.begin.z = result.smallend.vect[2];
      local_598.p = local_558.p + local_5d8.nstride * 3;
      local_598.begin.x = result.smallend.vect[0];
      local_598.begin.y = result.smallend.vect[1];
      local_598.begin.z = result.smallend.vect[2];
      local_5d8.p = local_598.p + local_5d8.nstride * 3;
      local_5d8.begin.x = result.smallend.vect[0];
      local_5d8.begin.y = result.smallend.vect[1];
      local_5d8.begin.z = result.smallend.vect[2];
      local_618._0_8_ = local_5d8.p + local_5d8.nstride * 3;
      local_418 = (ulong)(uint)local_6b4.smallend.vect[1];
      iVar8 = local_6b4.smallend.vect[1] - 1;
      local_630 = local_6b4.smallend.vect[2] + -1;
      iVar5 = local_6b4.bigend.vect[1] + 2;
      local_5ec.x = local_6b4.bigend.vect[0] - (local_6b4.btype.itype | 0xfffffffe);
      local_62c.z = local_6b4.bigend.vect[2] + 2;
      local_618._8_8_ = SEXT48(local_5ec.x - local_6b4.smallend.vect[0]);
      local_618._16_8_ = local_618._8_8_ * (long)(iVar5 - iVar8);
      local_618._24_8_ = local_618._16_8_ * (long)(local_62c.z - local_630);
      local_618._32_8_ = CONCAT44(iVar8,local_6b4.smallend.vect[0]);
      local_5ec.y = iVar5;
      iVar10 = local_6b4.smallend.vect[0] + -1;
      local_658._0_8_ = local_618._0_8_ + local_618._24_8_ * 8;
      iVar2 = local_6b4.bigend.vect[0] + 2;
      iVar9 = local_6b4.bigend.vect[1] - (local_6b4.btype.itype >> 1 | 0xfffffffe);
      local_62c.y = iVar9;
      local_62c.x = iVar2;
      local_66c.y = iVar5;
      local_66c.x = iVar2;
      local_698._8_8_ = SEXT48(iVar2 - iVar10);
      local_658._16_8_ = (long)(iVar9 - local_6b4.smallend.vect[1]) * local_698._8_8_;
      local_658._24_8_ = local_658._16_8_ * (long)(local_62c.z - local_630);
      local_658._32_8_ = CONCAT44(local_6b4.smallend.vect[1],iVar10);
      pdVar1 = (double *)(local_658._0_8_ + local_658._24_8_ * 8);
      local_66c.z = local_6b4.bigend.vect[2] - (local_6b4.btype.itype >> 2 | 0xfffffffe);
      local_698._16_8_ = (long)(iVar5 - iVar8) * local_698._8_8_;
      lVar6 = (long)(local_66c.z - local_6b4.smallend.vect[2]) * local_698._16_8_;
      local_698._32_8_ = CONCAT44(iVar8,iVar10);
      local_670 = local_6b4.smallend.vect[2];
      local_498.ncomp = 3;
      local_4d8.ncomp = 3;
      local_518.ncomp = 3;
      local_558.ncomp = 3;
      local_598.ncomp = 3;
      local_5d8.ncomp = 3;
      local_5e0 = 1;
      local_620 = 1;
      local_660 = 1;
      local_698._0_8_ = pdVar1;
      local_698._24_8_ = lVar6;
      local_658._8_8_ = local_698._8_8_;
      local_5f0 = local_630;
      local_5ec.z = local_62c.z;
      local_598.jstride = local_5d8.jstride;
      local_598.kstride = local_5d8.kstride;
      local_598.nstride = local_5d8.nstride;
      local_598.end._0_8_ = local_5d8.end._0_8_;
      local_598.end.z = local_5d8.end.z;
      local_558.jstride = local_5d8.jstride;
      local_558.kstride = local_5d8.kstride;
      local_558.nstride = local_5d8.nstride;
      local_558.end._0_8_ = local_5d8.end._0_8_;
      local_558.end.z = local_5d8.end.z;
      local_518.jstride = local_5d8.jstride;
      local_518.kstride = local_5d8.kstride;
      local_518.nstride = local_5d8.nstride;
      local_518.end._0_8_ = local_5d8.end._0_8_;
      local_518.end.z = local_5d8.end.z;
      local_4d8.jstride = local_5d8.jstride;
      local_4d8.kstride = local_5d8.kstride;
      local_4d8.nstride = local_5d8.nstride;
      local_4d8.end._0_8_ = local_5d8.end._0_8_;
      local_4d8.end.z = local_5d8.end.z;
      local_498.jstride = local_5d8.jstride;
      local_498.end._0_8_ = local_5d8.end._0_8_;
      local_498.end.z = local_5d8.end.z;
      if (use_ppm) {
        pGVar4 = geom;
        puVar7 = (undefined8 *)&stack0xfffffffffffff7f0;
        for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar7 = *(undefined8 *)&pGVar4->super_CoordSys;
          pGVar4 = (Geometry *)((long)pGVar4 + (ulong)bVar11 * -0x10 + 8);
          puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        }
        geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff830;
        geom_00.super_CoordSys.c_sys = in_stack_fffffffffffff7f0._0_4_;
        geom_00.super_CoordSys._4_4_ = in_stack_fffffffffffff7f0._4_4_;
        geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffff7f0._8_8_;
        geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffff7f0._16_8_;
        geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffff7f0._24_8_;
        geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffff7f0._32_8_;
        geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffff7f0._40_8_;
        geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffff7f0._48_8_;
        geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff7f0._56_8_;
        geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff838;
        geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff840;
        geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff848;
        geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff850;
        geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff858;
        geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff860;
        geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff868;
        geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff870;
        geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffff878;
        geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffff880;
        geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffff888;
        geom_00.roundoff_hi_f.arr._0_8_ = in_stack_fffffffffffff890;
        geom_00._168_8_ = in_stack_fffffffffffff898;
        geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff8a0;
        geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff8a8;
        geom_00.domain._20_8_ = in_stack_fffffffffffff8b0;
        PPM::PredictVelOnFaces
                  (&result,&local_498,&local_518,&local_598,&local_4d8,&local_558,&local_5d8,
                   &local_170,&local_170,geom_00,l_dt,d_bcrec);
      }
      else {
        local_6f8._20_4_ = local_6b4.bigend.vect[2] + 1;
        local_6f8._12_4_ = local_5ec.x + -1;
        local_6f8._16_4_ = local_6b4.bigend.vect[1] + 1;
        local_6f8._24_8_ = local_6f8._24_8_ & 0xffffffff00000000;
        local_6f8._0_8_ = local_618._32_8_;
        local_6f8._8_4_ = local_630;
        PLM::PredictVelOnXFace
                  ((Box *)local_6f8,3,&local_498,&local_4d8,&local_170,&local_170,geom,l_dt,
                   local_458,d_bcrec);
        local_6f8._0_8_ = local_658._32_8_;
        local_6f8._8_4_ = local_630;
        local_6f8._20_4_ = local_62c.z + -1;
        local_6f8._12_4_ = local_62c.x + -1;
        local_6f8._16_4_ = local_62c.y + -1;
        local_6f8._24_8_ = local_6f8._24_8_ & 0xffffffff00000000;
        PLM::PredictVelOnYFace
                  ((Box *)local_6f8,3,&local_518,&local_558,&local_170,&local_170,geom,l_dt,
                   h_bcrec_00,d_bcrec);
        local_6f8._0_8_ = local_698._32_8_;
        local_6f8._8_4_ = local_670;
        local_6f8._20_4_ = local_66c.z + -1;
        local_6f8._12_4_ = local_66c.x + -1;
        local_6f8._16_4_ = local_66c.y + -1;
        local_6f8._24_8_ = local_6f8._24_8_ & 0xffffffff00000000;
        PLM::PredictVelOnZFace
                  ((Box *)local_6f8,3,&local_598,&local_5d8,&local_170,&local_170,geom,l_dt,
                   h_bcrec_00,d_bcrec);
      }
      in_stack_fffffffffffff8a0 = local_448;
      local_3d0 = (double *)local_618._32_8_;
      local_3c8 = local_5f0;
      local_3bc = local_5ec.z + -1;
      local_3c4[0] = local_5ec.x + -1;
      local_3c4[1] = local_5ec.y + -1;
      local_3f0 = (double *)local_658._32_8_;
      local_3e8 = local_630;
      local_3dc = local_62c.z + -1;
      local_3e4[0] = local_62c.x + -1;
      local_3e4[1] = local_62c.y + -1;
      local_410 = (double *)local_698._32_8_;
      local_408 = local_670;
      local_3fc = local_66c.z + -1;
      local_404[0] = local_66c.x + -1;
      local_404[1] = local_66c.y + -1;
      local_6f8._0_8_ = local_498.p;
      local_6f8._8_4_ = (undefined4)local_498.jstride;
      local_6f8._12_4_ = (undefined4)((ulong)local_498.jstride >> 0x20);
      local_6f8._16_4_ = (undefined4)local_498.kstride;
      local_6f8._20_4_ = (undefined4)((ulong)local_498.kstride >> 0x20);
      local_6f8._24_8_ = local_498.nstride;
      local_6d8.z = local_498.begin.z;
      local_6d8.x = local_498.begin.x;
      local_6d8.y = local_498.begin.y;
      local_6cc.z = local_498.end.z;
      local_6cc.x = local_498.end.x;
      local_6cc.y = local_498.end.y;
      local_6c0 = local_498.ncomp;
      local_370._0_8_ = local_518.p;
      local_370._8_8_ = local_518.jstride;
      local_370._16_8_ = local_518.kstride;
      local_370._24_8_ = local_518.nstride;
      local_350.z = local_518.begin.z;
      local_350.x = local_518.begin.x;
      local_350.y = local_518.begin.y;
      local_344.z = local_518.end.z;
      local_344.x = local_518.end.x;
      local_344.y = local_518.end.y;
      local_338 = local_518.ncomp;
      local_3b0._0_8_ = local_598.p;
      local_3b0._8_8_ = local_598.jstride;
      local_3b0._16_8_ = local_598.kstride;
      local_3b0._24_8_ = local_598.nstride;
      local_390.z = local_598.begin.z;
      local_390.x = local_598.begin.x;
      local_390.y = local_598.begin.y;
      local_384.z = local_598.end.z;
      local_384.x = local_598.end.x;
      local_384.y = local_598.end.y;
      local_378 = local_598.ncomp;
      local_2b0.p = local_4d8.p;
      local_2b0.jstride = local_4d8.jstride;
      local_2b0.kstride = local_4d8.kstride;
      local_2b0.nstride = local_4d8.nstride;
      local_2b0.begin.z = local_4d8.begin.z;
      local_2b0.begin.x = local_4d8.begin.x;
      local_2b0.begin.y = local_4d8.begin.y;
      local_2b0.end.z = local_4d8.end.z;
      local_2b0.end.x = local_4d8.end.x;
      local_2b0.end.y = local_4d8.end.y;
      local_2b0.ncomp = local_4d8.ncomp;
      local_2f0.p = local_558.p;
      local_2f0.jstride = local_558.jstride;
      local_2f0.kstride = local_558.kstride;
      local_2f0.nstride = local_558.nstride;
      local_2f0.begin.z = local_558.begin.z;
      local_2f0.begin.x = local_558.begin.x;
      local_2f0.begin.y = local_558.begin.y;
      local_2f0.end.z = local_558.end.z;
      local_2f0.end.x = local_558.end.x;
      local_2f0.end.y = local_558.end.y;
      local_2f0.ncomp = local_558.ncomp;
      local_330.p = local_5d8.p;
      local_330.jstride = local_5d8.jstride;
      local_330.kstride = local_5d8.kstride;
      local_330.nstride = local_5d8.nstride;
      local_330.begin.z = local_5d8.begin.z;
      local_330.begin.x = local_5d8.begin.x;
      local_330.begin.y = local_5d8.begin.y;
      local_330.end.z = local_5d8.end.z;
      local_330.end.x = local_5d8.end.x;
      local_330.end.y = local_5d8.end.y;
      local_330.ncomp = local_5d8.ncomp;
      local_3b8.itype = 0;
      local_3d8.itype = 0;
      local_3f8.itype = 0;
      in_stack_fffffffffffff848 = &local_170;
      ComputeAdvectiveVel((Box *)&local_3d0,(Box *)&local_3f0,(Box *)&local_410,
                          (Array4<double> *)local_618,(Array4<double> *)local_658,
                          (Array4<double> *)local_698,(Array4<const_double> *)local_6f8,
                          (Array4<const_double> *)local_370,(Array4<const_double> *)local_3b0,
                          &local_2b0,&local_2f0,&local_330,in_stack_fffffffffffff848,&local_130,
                          local_448,l_dt,d_bcrec,use_forces_in_trans);
      local_6f8._0_8_ = local_618._0_8_;
      local_6f8._8_4_ = (undefined4)local_618._8_8_;
      local_6f8._12_4_ = SUB84(local_618._8_8_,4);
      local_6f8._16_4_ = (undefined4)local_618._16_8_;
      local_6f8._20_4_ = SUB84(local_618._16_8_,4);
      local_6f8._24_8_ = local_618._24_8_;
      local_6d8.z = local_5f0;
      local_6d8.x = local_618._32_4_;
      local_6d8.y = local_618._36_4_;
      local_6cc.z = local_5ec.z;
      local_6cc.x = local_5ec.x;
      local_6cc.y = local_5ec.y;
      local_6c0 = local_5e0;
      local_370._0_8_ = local_658._0_8_;
      local_370._8_8_ = local_658._8_8_;
      local_370._16_8_ = local_658._16_8_;
      local_370._24_8_ = local_658._24_8_;
      local_350.z = local_630;
      local_350.x = local_658._32_4_;
      local_350.y = local_658._36_4_;
      local_344.z = local_62c.z;
      local_344.x = local_62c.x;
      local_344.y = local_62c.y;
      local_338 = local_620;
      local_3b0._0_8_ = local_698._0_8_;
      local_3b0._8_8_ = local_698._8_8_;
      local_3b0._16_8_ = local_698._16_8_;
      local_3b0._24_8_ = local_698._24_8_;
      local_390.z = local_670;
      local_390.x = local_698._32_4_;
      local_390.y = local_698._36_4_;
      local_384.z = local_66c.z;
      local_384.x = local_66c.x;
      local_384.y = local_66c.y;
      local_378 = local_660;
      in_stack_fffffffffffff898 = &local_130;
      in_stack_fffffffffffff890 = &local_5d8;
      in_stack_fffffffffffff888 = &local_558;
      in_stack_fffffffffffff880 = &local_4d8;
      in_stack_fffffffffffff878 = &local_598;
      in_stack_fffffffffffff870 = &local_518;
      in_stack_fffffffffffff868 = &local_498;
      in_stack_fffffffffffff860 = (Array4<const_double> *)local_3b0;
      in_stack_fffffffffffff858 = (Array4<const_double> *)local_370;
      in_stack_fffffffffffff850 = (Array4<const_double> *)local_6f8;
      in_stack_fffffffffffff840 = &local_f0;
      in_stack_fffffffffffff838 = &local_b0;
      in_stack_fffffffffffff830 = 0x2bf61b;
      in_stack_fffffffffffff8a8 = local_450;
      in_stack_fffffffffffff8b0 = d_bcrec;
      ExtrapVelToFacesOnBox
                (&local_6b4,3,&local_1d4,&local_1f0,&local_20c,&local_70,in_stack_fffffffffffff838,
                 in_stack_fffffffffffff840,in_stack_fffffffffffff848,in_stack_fffffffffffff850,
                 in_stack_fffffffffffff858,in_stack_fffffffffffff860,in_stack_fffffffffffff868,
                 in_stack_fffffffffffff870,in_stack_fffffffffffff878,in_stack_fffffffffffff880,
                 in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff898,
                 in_stack_fffffffffffff8a0,local_450,l_dt,d_bcrec,use_forces_in_trans,pdVar1 + lVar6
                );
      amrex::Gpu::Device::streamSynchronize();
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  scratch.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
  amrex::BaseFab<double>::clear(&scratch.super_BaseFab<double>);
  return;
}

Assistant:

void
Godunov::ExtrapVelToFaces ( MultiFab const& a_vel,
                            MultiFab const& a_forces,
                            MultiFab& a_umac,
                            MultiFab& a_vmac,
                            MultiFab& a_wmac,
                            const Vector<BCRec> & h_bcrec,
                const        BCRec  * d_bcrec,
                            const Geometry& geom, Real l_dt,
                            bool use_ppm, bool use_forces_in_trans)
{
    Box const& domain = geom.Domain();
    const Real* dx    = geom.CellSize();

    const int ncomp = AMREX_SPACEDIM;
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        FArrayBox scratch;
        for (MFIter mfi(a_vel,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            Box const& bxg1 = amrex::grow(bx,1);

            Box const& xbx = mfi.nodaltilebox(0);
            Box const& ybx = mfi.nodaltilebox(1);
            Box const& zbx = mfi.nodaltilebox(2);

            Array4<Real> const& umac = a_umac.array(mfi);
            Array4<Real> const& vmac = a_vmac.array(mfi);
            Array4<Real> const& wmac = a_wmac.array(mfi);

            Array4<Real const> const& vel = a_vel.const_array(mfi);
            Array4<Real const> const& f   = a_forces.const_array(mfi);

            scratch.resize(bxg1, (ncomp*4 + 1)*AMREX_SPACEDIM);
            Real* p = scratch.dataPtr();

            Array4<Real> Imx = makeArray4(p,bxg1,ncomp);
            p +=         Imx.size();
            Array4<Real> Ipx = makeArray4(p,bxg1,ncomp);
            p +=         Ipx.size();
            Array4<Real> Imy = makeArray4(p,bxg1,ncomp);
            p +=         Imy.size();
            Array4<Real> Ipy = makeArray4(p,bxg1,ncomp);
            p +=         Ipy.size();
            Array4<Real> Imz = makeArray4(p,bxg1,ncomp);
            p +=         Imz.size();
            Array4<Real> Ipz = makeArray4(p,bxg1,ncomp);
            p +=         Ipz.size();
            Array4<Real> u_ad = makeArray4(p,Box(bx).grow(1,1).grow(2,1).surroundingNodes(0),1);
            p +=         u_ad.size();
            Array4<Real> v_ad = makeArray4(p,Box(bx).grow(0,1).grow(2,1).surroundingNodes(1),1);
            p +=         v_ad.size();
            Array4<Real> w_ad = makeArray4(p,Box(bx).grow(0,1).grow(1,1).surroundingNodes(2),1);
            p +=         w_ad.size();

            if (use_ppm)
            {
                PPM::PredictVelOnFaces( bxg1,
                                        Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                        vel, vel,
                                        geom, l_dt, d_bcrec);
            }
            else
            {
                PLM::PredictVelOnXFace( Box(u_ad), AMREX_SPACEDIM, Imx, Ipx, vel, vel,
                                         geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnYFace( Box(v_ad), AMREX_SPACEDIM, Imy, Ipy, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
                PLM::PredictVelOnZFace( Box(w_ad), AMREX_SPACEDIM, Imz, Ipz, vel, vel,
                                        geom, l_dt, h_bcrec, d_bcrec);
            }

            ComputeAdvectiveVel( Box(u_ad), Box(v_ad), Box(w_ad),
                                 u_ad, v_ad, w_ad,
                                 Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                 vel, f, domain, l_dt, d_bcrec, use_forces_in_trans);

            ExtrapVelToFacesOnBox( bx, ncomp,
                                   xbx, ybx, zbx,
                                   umac, vmac, wmac, vel,
                                   u_ad, v_ad, w_ad,
                                   Imx, Imy, Imz, Ipx, Ipy, Ipz,
                                   f, domain, dx, l_dt, d_bcrec, use_forces_in_trans, p);

            Gpu::streamSynchronize();  // otherwise we might be using too much memory
        }
    }
}